

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,Options *options,shared_ptr<const_onmt::SubwordEncoder> *subword_encoder)

{
  (this->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_003b60a8;
  Options::Options(&this->_options,options);
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Options::validate(&this->_options);
  set_subword_encoder(this,subword_encoder);
  return;
}

Assistant:

Tokenizer::Tokenizer(Options options,
                       const std::shared_ptr<const SubwordEncoder>& subword_encoder)
    : _options(std::move(options))
  {
    _options.validate();
    set_subword_encoder(subword_encoder);
  }